

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3BeginWriteOperation(Parse *pParse,int setStatement,int iDb)

{
  Parse *pToplevel;
  
  pToplevel = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pToplevel = pParse;
  }
  sqlite3CodeVerifySchemaAtToplevel(pToplevel,iDb);
  pToplevel->writeMask = pToplevel->writeMask | 1 << ((byte)iDb & 0x1f);
  pToplevel->isMultiWrite = pToplevel->isMultiWrite | (byte)setStatement;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BeginWriteOperation(Parse *pParse, int setStatement, int iDb){
  Parse *pToplevel = sqlite3ParseToplevel(pParse);
  sqlite3CodeVerifySchemaAtToplevel(pToplevel, iDb);
  DbMaskSet(pToplevel->writeMask, iDb);
  pToplevel->isMultiWrite |= setStatement;
}